

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  PropertyId propertyId_00;
  int iVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  SymOpnd *this_01;
  PropertySymOpnd *pPVar6;
  RegOpnd *dstOpnd;
  PropertySym *propertySym;
  ScriptContextInfo *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JITTimeProfileInfo *this_02;
  FldInfo *pFVar8;
  ProfiledInstr *pPVar9;
  FldInfo *pFVar10;
  AddrOpnd *local_60;
  Opnd *srcOpnd;
  PropertySym *fieldSym;
  BuiltinFunction builtInIndex;
  bool reuseLoc;
  JitProfilingInstr *pJStack_48;
  bool isLdFldThatWasNotProfiled;
  Instr *instr;
  RegOpnd *regOpnd;
  SymOpnd *fieldSymOpnd;
  bool isProfiled;
  PropertyId propertyId;
  CacheId inlineCacheIndex_local;
  RegSlot regSlot_local;
  RegSlot instance_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instance_local._2_2_ = newOpcode;
  _offset_local = this;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1233,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = OpCodeAttr::IsProfiledOp(instance_local._2_2_);
  if (bVar2) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&instance_local + 2));
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetPropertyIdFromCacheId(this_00,inlineCacheIndex);
  this_01 = BuildFieldOpnd(this,instance_local._2_2_,instance,propertyId_00,0xffffffff,
                           PropertyKindData,inlineCacheIndex);
  pJStack_48 = (JitProfilingInstr *)0x0;
  fieldSym._7_1_ = 0;
  fieldSym._6_1_ = 0;
  switch(instance_local._2_2_) {
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12b1,"((0))","Unknown ElementCP opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  case LdFld_ReuseLoc:
    fieldSym._6_1_ = 1;
    instance_local._2_2_ = LdFld;
  case LdFld:
  case LdFldForTypeOf:
  case LdLen_A:
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (bVar3) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
      IR::PropertySymOpnd::TryDisableRuntimePolymorphicCache(pPVar6);
    }
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
  case ScopedLdMethodFld:
  case LdRootFldForTypeOf:
    dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,(bool)(fieldSym._6_1_ & 1));
    if (bVar2) {
      pJStack_48 = (JitProfilingInstr *)
                   BuildProfiledFieldLoad
                             (this,instance_local._2_2_,dstOpnd,this_01,inlineCacheIndex,
                              (bool *)((long)&fieldSym + 7));
    }
    if (pJStack_48 == (JitProfilingInstr *)0x0) {
      pJStack_48 = (JitProfilingInstr *)
                   IR::Instr::New(instance_local._2_2_,&dstOpnd->super_Opnd,&this_01->super_Opnd,
                                  this->m_func);
    }
    if ((((instance_local._2_2_ == LdFld) || (instance_local._2_2_ == LdFldForCallApplyTarget)) ||
        (instance_local._2_2_ == LdMethodFld)) ||
       ((instance_local._2_2_ == LdRootMethodFld || (instance_local._2_2_ == ScopedLdMethodFld)))) {
      Js::BuiltinFunction::BuiltinFunction((BuiltinFunction *)((long)&fieldSym + 5),None);
      propertySym = Sym::AsPropertySym(this_01->m_sym);
      CheckBuiltIn(this,propertySym,(BuiltinFunction *)((long)&fieldSym + 5));
      (dstOpnd->m_sym->m_builtInIndex)._value = fieldSym._5_1_;
    }
    break;
  case StFld:
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (bVar3) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
      IR::PropertySymOpnd::TryDisableRuntimePolymorphicCache(pPVar6);
    }
  case InitUndeclLetFld:
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
  case InitRootFld:
  case InitUndeclConstFld:
    if (instance_local._2_2_ == InitUndeclLetFld) {
      pSVar7 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar7->_vptr_ScriptContextInfo[4])();
      local_60 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar4),AddrOpndKindDynamicVar,this->m_func,
                                   true,(Var)0x0);
      IR::Opnd::SetValueType(&local_60->super_Opnd,ValueType::PrimitiveOrObject);
      instance_local._2_2_ = InitLetFld;
    }
    else if (instance_local._2_2_ == InitUndeclConstFld) {
      pSVar7 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar7->_vptr_ScriptContextInfo[4])();
      local_60 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar4),AddrOpndKindDynamicVar,
                                   this->m_func,true,(Var)0x0);
      IR::Opnd::SetValueType(&local_60->super_Opnd,ValueType::PrimitiveOrObject);
      instance_local._2_2_ = InitConstFld;
    }
    else {
      local_60 = (AddrOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
    }
    if (bVar2) {
      bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if (bVar2) {
        pJStack_48 = IR::JitProfilingInstr::New
                               (instance_local._2_2_,&this_01->super_Opnd,&local_60->super_Opnd,
                                this->m_func);
      }
      else {
        bVar2 = Func::HasProfileInfo(this->m_func);
        if (bVar2) {
          pJStack_48 = (JitProfilingInstr *)
                       IR::ProfiledInstr::New
                                 (instance_local._2_2_,&this_01->super_Opnd,&local_60->super_Opnd,
                                  this->m_func);
          this_02 = Func::GetReadOnlyProfileInfo(this->m_func);
          pFVar8 = JITTimeProfileInfo::GetFldInfo(this_02,inlineCacheIndex);
          pPVar9 = IR::Instr::AsProfiledInstr(&pJStack_48->super_Instr);
          pFVar10 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                              ((anon_union_8_4_88fdcd80 *)&(pPVar9->u).field_3);
          *pFVar10 = *pFVar8;
        }
      }
    }
    if (pJStack_48 == (JitProfilingInstr *)0x0) {
      pJStack_48 = (JitProfilingInstr *)
                   IR::Instr::New(instance_local._2_2_,&this_01->super_Opnd,&local_60->super_Opnd,
                                  this->m_func);
    }
  }
  AddInstr(this,&pJStack_48->super_Instr,offset);
  if (((fieldSym._7_1_ & 1) != 0) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,&pJStack_48->super_Instr);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::PropertyId  propertyId;
    bool isProfiled = OpCodeAttr::IsProfiledOp(newOpcode);

    if (isProfiled)
    {
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
    }

    propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);

    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType)-1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd *   regOpnd;

    IR::Instr *     instr = nullptr;
    bool isLdFldThatWasNotProfiled = false;
    bool reuseLoc = false;
    switch (newOpcode)
    {
    case Js::OpCode::LdFld_ReuseLoc:
        reuseLoc = true;
        newOpcode = Js::OpCode::LdFld;
        // fall through
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdLen_A:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
        // Load
        // LdMethodFromFlags is backend only. Don't need to be added here.
        regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);

        if (isProfiled)
        {
            instr = this->BuildProfiledFieldLoad(newOpcode, regOpnd, fieldSymOpnd, inlineCacheIndex, &isLdFldThatWasNotProfiled);
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }

        if (newOpcode == Js::OpCode::LdFld ||
            newOpcode == Js::OpCode::LdFldForCallApplyTarget ||
            newOpcode == Js::OpCode::LdMethodFld ||
            newOpcode == Js::OpCode::LdRootMethodFld ||
            newOpcode == Js::OpCode::ScopedLdMethodFld)
        {
            // Check whether we're loading (what appears to be) a built-in method.
            Js::BuiltinFunction builtInIndex = Js::BuiltinFunction::None;
            PropertySym *fieldSym = fieldSymOpnd->m_sym->AsPropertySym();
            this->CheckBuiltIn(fieldSym, &builtInIndex);
            regOpnd->m_sym->m_builtInIndex = builtInIndex;
        }
        break;

    case Js::OpCode::StFld:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::InitLetFld:
    case Js::OpCode::InitRootLetFld:
    case Js::OpCode::InitConstFld:
    case Js::OpCode::InitRootConstFld:
    case Js::OpCode::InitUndeclLetFld:
    case Js::OpCode::InitUndeclConstFld:
    case Js::OpCode::InitClassMember:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    {
        IR::Opnd *srcOpnd;
        // Store
        if (newOpcode == Js::OpCode::InitUndeclLetFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitLetFld;
        }
        else if (newOpcode == Js::OpCode::InitUndeclConstFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitConstFld;
        }
        else
        {
            srcOpnd = this->BuildSrcOpnd(regSlot);
        }

        if (isProfiled)
        {
            if (m_func->DoSimpleJitDynamicProfile())
            {
                instr = IR::JitProfilingInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
            }
            else if (this->m_func->HasProfileInfo())
            {

                instr = IR::ProfiledInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
                instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
            }
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
        }
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementCP opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdFldThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}